

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O1

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  size_t sVar4;
  ImageU8 *pIVar5;
  byte bVar6;
  int iVar7;
  void *pvVar8;
  IOException *pIVar9;
  long *plVar10;
  size_type *psVar11;
  size_t __n;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  pos_type pVar21;
  int depth;
  long height;
  long width;
  long maxval;
  float scale;
  ifstream in;
  undefined1 auStack_378 [7];
  allocator local_371;
  long local_370;
  long local_368;
  ulong local_360;
  long local_358;
  ulong local_350;
  void *local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  ImageU8 *local_320;
  int local_314;
  void *local_310;
  __mbstate_t local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  long local_2a0;
  size_t local_298;
  long local_290;
  long local_288;
  long local_280;
  void *local_278;
  void *local_270;
  long local_268;
  long local_260;
  long local_258;
  ulong local_250;
  long local_248;
  float local_23c;
  string local_238;
  byte *local_218;
  byte *local_210;
  
  local_338 = x;
  local_330 = y;
  local_320 = image;
  iVar7 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar7 == '\0') {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2c0,name,&local_371);
    std::operator+(&local_2e0,"Can only load PNM image (",&local_2c0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_238._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar10[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    gutil::IOException::IOException(pIVar9,&local_238);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pVar21 = anon_unknown_11::readPNMHeader
                     (name,&local_314,&local_248,&local_23c,&local_2e8,&local_2f0);
  pIVar5 = local_320;
  local_308 = pVar21._M_state;
  if ((local_23c != 0.0) || (NAN(local_23c))) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2c0,name,&local_371);
    std::operator+(&local_2e0,"A float image cannot be loaded as 8 bit image (",&local_2c0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_238._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar10[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    gutil::IOException::IOException(pIVar9,&local_238);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (0xff < local_248) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_2c0,name,&local_371);
    std::operator+(&local_2e0,"A 16 bit image cannot be loaded as 8 bit image (",&local_2c0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_238._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_238._M_dataplus._M_p == psVar11) {
      local_238.field_2._M_allocated_capacity = *psVar11;
      local_238.field_2._8_8_ = plVar10[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar11;
    }
    local_238._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    gutil::IOException::IOException(pIVar9,&local_238);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  uVar12 = 1;
  if (1 < ds) {
    uVar12 = (ulong)(uint)ds;
  }
  local_370 = w;
  if (w < 0) {
    local_370 = (long)(local_2e8 + uVar12 + -1) / (long)uVar12;
  }
  if (h < 0) {
    h = (long)(local_2f0 + uVar12 + -1) / (long)uVar12;
  }
  local_350 = (ulong)local_314;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (local_320,local_370,h,local_350);
  sVar4 = pIVar5->n;
  __n = -sVar4;
  if (0 < (long)sVar4) {
    __n = sVar4;
  }
  memset(pIVar5->pixel,0,__n);
  std::ifstream::ifstream(&local_238);
  lVar18 = *(long *)(local_238._M_dataplus._M_p + -0x18);
  *(undefined4 *)((long)&local_238.field_2 + lVar18 + 0xc) = 7;
  local_340 = pVar21._M_off;
  std::ios::clear((int)auStack_378 + (int)lVar18 + 0x140);
  std::ifstream::open((char *)&local_238,(_Ios_Openmode)name);
  iVar7 = (int)local_350;
  uVar13 = local_350 & 0xffffffff;
  local_368 = local_2e8;
  local_358 = local_2f0;
  if ((((ds < 2) && (local_330 == 0 && local_338 == 0)) && (local_370 == local_2e8)) &&
     (h == local_2f0)) {
    std::istream::seekg(&local_238,local_340,local_308);
    if (0 < local_358) {
      uVar12 = local_350 & 0xffffffff;
      lVar18 = 0;
      do {
        if (0 < local_368) {
          lVar16 = 0;
          do {
            if (0 < iVar7) {
              uVar13 = 0;
              do {
                if (local_218 < local_210) {
                  bVar6 = *local_218;
                  local_218 = local_218 + 1;
                }
                else {
                  bVar6 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                    (&local_238.field_2);
                }
                local_320->img[uVar13][lVar18][lVar16] = bVar6;
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != local_368);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != local_358);
    }
  }
  else {
    local_360 = CONCAT44(local_360._4_4_,ds);
    lVar18 = local_370 * local_350;
    uVar20 = lVar18 * 4;
    pvVar8 = operator_new(uVar20);
    if (lVar18 != 0) {
      memset(pvVar8,0,uVar20);
    }
    local_348 = operator_new(uVar20);
    if (lVar18 != 0) {
      memset(local_348,0,uVar20);
    }
    lVar16 = 0;
    if (-local_330 != 0 && local_330 < 1) {
      lVar16 = -local_330;
    }
    if (lVar16 < h) {
      local_260 = local_368 * local_350;
      lVar15 = 0;
      if (0 < local_338) {
        lVar15 = local_338;
      }
      local_328 = -local_338;
      if (-local_338 == 0 || 0 < local_338) {
        local_328 = 0;
      }
      local_2a0 = local_328 * local_350;
      local_2f8 = (long)(int)local_360;
      local_270 = (void *)((long)local_348 + local_2a0 * 4);
      local_300 = local_350 * 4;
      local_278 = (void *)((long)pvVar8 + local_2a0 * 4);
      local_268 = lVar15 * uVar12 * local_350 + local_340;
      local_360 = uVar12;
      local_310 = pvVar8;
      local_298 = uVar20;
      local_290 = lVar18;
      local_288 = h;
      do {
        sVar4 = local_298;
        local_258 = (lVar16 + local_330) * uVar12;
        pvVar8 = local_310;
        if (local_358 <= local_258) break;
        local_280 = lVar16;
        if (local_290 != 0) {
          memset(local_310,0,local_298);
          memset(local_348,0,sVar4);
          uVar12 = local_360;
        }
        uVar20 = 0;
        do {
          if (local_358 <= (long)(uVar20 + local_258)) break;
          local_250 = uVar20;
          std::istream::seekg(&local_238,(uVar20 + local_258) * local_260 + local_268,local_308);
          lVar18 = local_2f8;
          pvVar8 = local_270;
          pvVar14 = local_278;
          lVar16 = local_300;
          lVar15 = local_328;
          uVar12 = local_360;
          if (local_328 < local_370) {
            do {
              lVar17 = (lVar15 + local_338) * uVar12;
              if (local_368 <= lVar17) break;
              lVar19 = 0;
              do {
                if (0 < (int)local_350) {
                  uVar20 = 0;
                  do {
                    if (local_218 < local_210) {
                      bVar6 = *local_218;
                      local_218 = local_218 + 1;
                    }
                    else {
                      local_340 = lVar15;
                      bVar6 = (**(code **)(local_238.field_2._M_allocated_capacity + 0x50))
                                        (&local_238.field_2);
                      lVar18 = local_2f8;
                      lVar16 = local_300;
                      lVar15 = local_340;
                      uVar12 = local_360;
                    }
                    piVar2 = (int *)((long)pvVar14 + uVar20 * 4);
                    *piVar2 = *piVar2 + (uint)bVar6;
                    piVar2 = (int *)((long)pvVar8 + uVar20 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar20 = uVar20 + 1;
                  } while (uVar13 != uVar20);
                }
              } while ((lVar19 + 1 < lVar18) &&
                      (lVar1 = lVar19 + lVar17, lVar19 = lVar19 + 1, lVar1 + 1 < local_368));
              lVar15 = lVar15 + 1;
              pvVar8 = (void *)((long)pvVar8 + lVar16);
              pvVar14 = (void *)((long)pvVar14 + lVar16);
            } while (lVar15 != local_370);
          }
          uVar20 = local_250 + 1;
        } while (uVar20 != uVar12);
        lVar18 = local_328;
        lVar16 = local_2a0;
        if (local_328 < local_370) {
          do {
            if (local_368 <= (long)((local_338 + lVar18) * uVar12)) break;
            if (0 < iVar7) {
              uVar12 = 0;
              do {
                iVar3 = *(int *)((long)local_348 + uVar12 * 4 + lVar16 * 4);
                if (0 < iVar3) {
                  local_320->img[uVar12][local_280][lVar18] =
                       (uchar)(*(int *)((long)local_310 + uVar12 * 4 + lVar16 * 4) / iVar3);
                }
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
              lVar16 = lVar16 + uVar12;
              uVar12 = local_360;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != local_370);
        }
        lVar16 = local_280 + 1;
        pvVar8 = local_310;
      } while (lVar16 != local_288);
    }
    operator_delete(local_348);
    operator_delete(pvVar8);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_238);
  return;
}

Assistant:

void PNMImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w*depth);
      std::valarray<int> nline(0, w*depth);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth+
                   static_cast<std::streamoff>(std::max(0l, x))*ds*depth);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              for (int d=0; d<depth; d++)
              {
                ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

                if (image.isValidS(v))
                {
                  vline[j+d]+=v;
                  nline[j+d]++;
                }
              }
            }

            j+=depth;
          }
        }

        // store line into image

        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
    }
    else // load whole image
    {
      in.seekg(pos);
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(sb->sbumpc()));
          }
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}